

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpsrv.cpp
# Opt level: O0

vm_httpsrv_ext * vm_httpsrv_ext::alloc_ext(CVmObjHTTPServer *self)

{
  int iVar1;
  CVmVarHeap *pCVar2;
  undefined4 extraout_var;
  undefined8 in_RDI;
  vm_httpsrv_ext *ext;
  size_t siz;
  vm_httpsrv_ext *pvVar3;
  
  pCVar2 = CVmMemory::get_var_heap(G_mem_X);
  iVar1 = (*pCVar2->_vptr_CVmVarHeap[4])(pCVar2,0x10,in_RDI);
  pvVar3 = (vm_httpsrv_ext *)CONCAT44(extraout_var,iVar1);
  pvVar3->l = (TadsListener *)0x0;
  pvVar3->addr = (char *)0x0;
  return pvVar3;
}

Assistant:

vm_httpsrv_ext *vm_httpsrv_ext::alloc_ext(
    VMG_ CVmObjHTTPServer *self)
{
    /* calculate how much space we need */
    size_t siz = sizeof(vm_httpsrv_ext);

    /* allocate the memory */
    vm_httpsrv_ext *ext = (vm_httpsrv_ext *)
                          G_mem->get_var_heap()->alloc_mem(siz, self);

    /* we don't have a listener or binding address yet */
    ext->l = 0;
    ext->addr = 0;

    /* return the new extension */
    return ext;
}